

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:674:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:674:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr_untyped local_28;
  
  local_28.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_28.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  if (local_28.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_28.heap_,&local_28);
  }
  anon_unknown_110::array_reduce
            (__return_storage_ptr__,(gc_heap_ptr<mjs::global_object> *)&local_28,this_,args,false);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_28);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }